

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O3

_Bool compare_negations(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  bool bVar2;
  char *__s;
  ulong uVar3;
  
  bVar2 = true;
  if (count != 0) {
    _Var1 = is_negation_correct(*rnorun);
    __s = "no-run negation incorrect";
    if (_Var1) {
      uVar3 = 1;
      bVar2 = false;
      do {
        _Var1 = is_negation_correct(rruns[uVar3 - 1]);
        if (!_Var1) {
          __s = "runs negations incorrect";
          goto LAB_00103aa6;
        }
        if (count == uVar3) {
          return true;
        }
        bVar2 = count <= uVar3;
        _Var1 = is_negation_correct(rnorun[uVar3]);
        uVar3 = uVar3 + 1;
      } while (_Var1);
      __s = "no-run negation incorrect";
    }
    else {
      bVar2 = false;
    }
LAB_00103aa6:
    puts(__s);
  }
  return bVar2;
}

Assistant:

bool compare_negations(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                       size_t count) {
    for (size_t i = 0; i < count; ++i) {
        if (!is_negation_correct(rnorun[i])) {
            printf("no-run negation incorrect\n");
            return false;
        }
        if (!is_negation_correct(rruns[i])) {
            printf("runs negations incorrect\n");
            return false;
        }
    }
    return true;
}